

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

TapBranch * __thiscall
cfd::core::TapBranch::ChangeTapLeaf
          (TapBranch *__return_storage_ptr__,TapBranch *this,Script *tapscript,
          vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *target_nodes)

{
  ByteData256 *pBVar1;
  pointer pBVar2;
  unsigned_long *puVar3;
  bool bVar4;
  pointer pTVar5;
  CfdException *pCVar6;
  ByteData256 *this_00;
  pointer pBVar7;
  ByteData256 *object;
  TapBranch *this_01;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> check_nodes;
  string reverse_nodes_str;
  vector<unsigned_long,_std::allocator<unsigned_long>_> target_branch_indexes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> checked_nodes_size_list;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> reverse_nodes;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> branch_nodes;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> new_branches;
  string check_nodes_str;
  string hex;
  unsigned_long local_220;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_218;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  unsigned_long *local_1d8;
  iterator iStack_1d0;
  unsigned_long *local_1c8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *local_1c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1b8;
  Script *local_198;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_190;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_178;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_160;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_148;
  TapBranch *local_128;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110 [6];
  TapBranch local_a8;
  
  local_1c0 = target_nodes;
  local_198 = tapscript;
  bVar4 = IsFindTapScript(this,tapscript);
  if (!bVar4) {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_120._0_8_ = local_110;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_120,"This tapscript not exist in this tree.","");
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_120);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  (*this->_vptr_TapBranch[4])(&local_160,this);
  if ((this->has_leaf_ == true) &&
     (bVar4 = Script::Equals(&this->script_,local_198),
     object = local_160.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_start, bVar4)) {
    this_00 = (local_1c0->
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (local_1c0->
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (this_00 == pBVar1) {
LAB_003699ff:
      TapBranch(__return_storage_ptr__,this);
      goto LAB_003699dd;
    }
    if (((long)pBVar1 - (long)this_00 ==
         (long)local_160.
               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)local_160.
               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
               _M_impl.super__Vector_impl_data._M_start) &&
       (bVar4 = ByteData256::operator==
                          (this_00,local_160.
                                   super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                   ._M_impl.super__Vector_impl_data._M_start), bVar4)) {
      do {
        object = object + 1;
        this_00 = this_00 + 1;
        if (this_00 == pBVar1) goto LAB_003699ff;
        bVar4 = ByteData256::operator==(this_00,object);
      } while (bVar4);
    }
  }
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&local_190,local_1c0);
  if (local_190.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_190.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ::std::
    __reverse<__gnu_cxx::__normal_iterator<cfd::core::ByteData256*,std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>>>
              ();
  }
  pBVar2 = local_190.
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_1f8 = local_1e8;
  local_1f0 = 0;
  local_1e8[0] = 0;
  local_128 = __return_storage_ptr__;
  if (local_190.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_190.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pBVar7 = local_190.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      ByteData256::GetHex_abi_cxx11_((string *)local_120,pBVar7);
      ::std::__cxx11::string::_M_append((char *)&local_1f8,local_120._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._0_8_ != local_110) {
        operator_delete((void *)local_120._0_8_);
      }
      pBVar7 = pBVar7 + 1;
    } while (pBVar7 != pBVar2);
  }
  local_1d8 = (unsigned_long *)0x0;
  iStack_1d0._M_current = (unsigned_long *)0x0;
  local_1c8 = (unsigned_long *)0x0;
  local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_148.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_start = (TapBranch *)0x0;
  local_148.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_finish = (TapBranch *)0x0;
  local_220 = 0;
  pTVar5 = (this->branch_list_).
           super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->branch_list_).
      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar5) {
    do {
      this_01 = pTVar5 + local_220;
      bVar4 = IsFindTapScript(this_01,local_198);
      if (bVar4) {
        local_218.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_start = (ByteData256 *)0x0;
        local_218.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_finish = (ByteData256 *)0x0;
        local_218.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (local_190.
            super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_190.
            super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          if (iStack_1d0._M_current == local_1c8) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1d8,iStack_1d0,
                       &local_220);
          }
          else {
            *iStack_1d0._M_current = local_220;
            iStack_1d0._M_current = iStack_1d0._M_current + 1;
          }
          local_120._0_8_ = local_120._0_8_ & 0xffffffff00000000;
          if (local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<int>
                      (&local_1b8,
                       (iterator)
                       local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(int *)local_120);
          }
          else {
            *local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          (*this_01->_vptr_TapBranch[4])(&local_178,this_01);
          uVar10 = ((long)local_160.
                          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_160.
                          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          lVar11 = (long)local_160.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_160.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          while( true ) {
            uVar10 = uVar10 - 1;
            if (uVar10 <= local_220) break;
            ::std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
            emplace_back<cfd::core::ByteData256&>
                      ((vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)
                       &local_218,
                       (ByteData256 *)
                       ((long)&local_160.
                               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar11));
            lVar11 = lVar11 + -0x18;
          }
          if (local_220 == 0) {
            GetBaseHash((ByteData256 *)local_120,this);
            ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
            emplace_back<cfd::core::ByteData256>(&local_218,(ByteData256 *)local_120);
          }
          else {
            GetBranchHash((ByteData256 *)local_120,this,(char)local_220 + 0xff);
            ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
            emplace_back<cfd::core::ByteData256>(&local_218,(ByteData256 *)local_120);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete((void *)local_120._0_8_);
          }
          pBVar2 = local_218.
                   super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_120._0_8_ = local_110;
          local_120._8_8_ = (pointer)0x0;
          local_110[0]._M_local_buf[0] = '\0';
          for (pBVar7 = local_218.
                        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                        ._M_impl.super__Vector_impl_data._M_start; pBVar7 != pBVar2;
              pBVar7 = pBVar7 + 1) {
            ByteData256::GetHex_abi_cxx11_((string *)&local_a8,pBVar7);
            ::std::__cxx11::string::_M_append((char *)local_120,(ulong)local_a8._vptr_TapBranch);
            if ((Script *)local_a8._vptr_TapBranch != &local_a8.script_) {
              operator_delete(local_a8._vptr_TapBranch);
            }
          }
          if (local_218.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_218.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar11 = 0;
            uVar10 = 0;
            do {
              bVar4 = ByteData256::Equals((ByteData256 *)
                                          ((long)&((local_190.
                                                                                                        
                                                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->data_)
                                                  .
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar11
                                          ),(ByteData256 *)
                                            ((long)&((local_218.
                                                                                                            
                                                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->data_)
                                                  .
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar11
                                            ));
              if (!bVar4) goto LAB_00369660;
              uVar10 = uVar10 + 1;
              lVar11 = lVar11 + 0x18;
            } while (uVar10 < (ulong)(((long)local_218.
                                             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_218.
                                             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x5555555555555555));
          }
          if (iStack_1d0._M_current == local_1c8) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1d8,iStack_1d0,
                       &local_220);
          }
          else {
            *iStack_1d0._M_current = local_220;
            iStack_1d0._M_current = iStack_1d0._M_current + 1;
          }
          local_a8._vptr_TapBranch =
               (_func_int **)
               (((long)local_218.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_218.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
          if (local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_1b8,
                       (iterator)
                       local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_a8);
          }
          else {
            *local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_a8._vptr_TapBranch;
            local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
LAB_00369660:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._0_8_ != local_110) {
            operator_delete((void *)local_120._0_8_);
          }
          ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    (&local_178);
        }
        ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_218);
      }
      local_220 = local_220 + 1;
      pTVar5 = (this->branch_list_).
               super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (local_220 <
             (ulong)(((long)(this->branch_list_).
                            super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 3) *
                    -0x1111111111111111));
  }
  if (iStack_1d0._M_current != local_1d8) {
    uVar10 = 0;
    do {
      puVar3 = local_1d8;
      local_218.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_start = (ByteData256 *)0x0;
      local_218.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_finish = (ByteData256 *)0x0;
      local_218.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pBVar2 = (local_1c0->
               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pBVar7 = (local_1c0->
               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if ((pBVar2 != pBVar7) &&
         (lVar11 = ((long)pBVar7 - (long)pBVar2 >> 3) * -0x5555555555555555 -
                   local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar10], lVar11 != 0)) {
        lVar8 = 0;
        do {
          ::std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
          emplace_back<cfd::core::ByteData256_const&>
                    ((vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)
                     &local_218,
                     (ByteData256 *)
                     ((long)&(((local_1c0->
                               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                               )._M_impl.super__Vector_impl_data._M_start)->data_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar8));
          lVar8 = lVar8 + 0x18;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      ChangeTapLeaf((TapBranch *)local_120,
                    (this->branch_list_).
                    super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                    _M_impl.super__Vector_impl_data._M_start + puVar3[uVar10],local_198,&local_218);
      GetBaseHash((ByteData256 *)&local_a8,(TapBranch *)local_120);
      bVar4 = ByteData256::IsEmpty((ByteData256 *)&local_a8);
      if (local_a8._vptr_TapBranch != (_func_int **)0x0) {
        operator_delete(local_a8._vptr_TapBranch);
      }
      if (!bVar4) {
        TapBranch(&local_a8,this);
        local_178.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_178.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_178.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar3[uVar10] != 0) {
          lVar11 = 0;
          uVar9 = 0;
          do {
            ::std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
            emplace_back<cfd::core::TapBranch_const&>
                      ((vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> *)
                       &local_178,
                       (TapBranch *)
                       ((long)&((this->branch_list_).
                                super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_TapBranch + lVar11
                       ));
            uVar9 = uVar9 + 1;
            lVar11 = lVar11 + 0x78;
          } while (uVar9 < puVar3[uVar10]);
        }
        ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::operator=
                  (&local_a8.branch_list_,
                   (vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&local_178
                  );
        AddBranch((TapBranch *)local_120,&local_a8);
        uVar9 = puVar3[uVar10];
        lVar11 = uVar9 * 0x78;
        while( true ) {
          uVar9 = uVar9 + 1;
          pTVar5 = (this->branch_list_).
                   super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(this->branch_list_).
                             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 3) *
                     -0x1111111111111111) <= uVar9) break;
          AddBranch((TapBranch *)local_120,(TapBranch *)((long)&pTVar5[1]._vptr_TapBranch + lVar11))
          ;
          lVar11 = lVar11 + 0x78;
        }
        ::std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
        emplace_back<cfd::core::TapBranch&>
                  ((vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> *)&local_148,
                   (TapBranch *)local_120);
        ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
                  ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&local_178
                  );
        ~TapBranch(&local_a8);
      }
      ~TapBranch((TapBranch *)local_120);
      ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_218);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)iStack_1d0._M_current - (long)local_1d8 >> 3));
  }
  __return_storage_ptr__ = local_128;
  if (local_148.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_148.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_120._0_8_ = local_110;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_120,"The specified tapscript does not exist under this branch.","");
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_120);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  TapBranch(local_128,
            local_148.
            super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
            super__Vector_impl_data._M_start);
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_148);
  if (local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1d8 != (unsigned_long *)0x0) {
    operator_delete(local_1d8);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_190);
LAB_003699dd:
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_160);
  return __return_storage_ptr__;
}

Assistant:

TapBranch TapBranch::ChangeTapLeaf(
    const Script& tapscript,
    const std::vector<ByteData256>& target_nodes) const {
  if (!IsFindTapScript(tapscript)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "This tapscript not exist in this tree.");
  }
  auto nodes = GetNodeList();
  if (has_leaf_ && script_.Equals(tapscript)) {
    if (target_nodes.empty() || (target_nodes == nodes)) return *this;
  }

  auto reverse_nodes = target_nodes;
  if (!reverse_nodes.empty()) {
    std::reverse(reverse_nodes.begin(), reverse_nodes.end());
  }
  std::string reverse_nodes_str;
  for (const auto& node : reverse_nodes) reverse_nodes_str += node.GetHex();

  std::vector<size_t> target_branch_indexes;
  std::vector<size_t> checked_nodes_size_list;

  std::vector<TapBranch> new_branches;
  for (size_t index = 0; index < branch_list_.size(); ++index) {
    const auto& branch = branch_list_[index];
    if (branch.IsFindTapScript(tapscript)) {
      std::vector<ByteData256> check_nodes;
      if (reverse_nodes.empty()) {
        target_branch_indexes.emplace_back(index);
        checked_nodes_size_list.emplace_back(0);
      } else {
        auto branch_nodes = branch.GetNodeList();
        for (size_t idx = nodes.size() - 1; idx > index; --idx) {
          check_nodes.emplace_back(nodes[idx]);
        }
        if (index == 0) {
          check_nodes.emplace_back(GetBaseHash());
        } else {
          check_nodes.emplace_back(
              GetBranchHash(static_cast<uint8_t>(index - 1)));
        }

        std::string check_nodes_str;
        for (const auto& node : check_nodes) {
          auto hex = node.GetHex();
          check_nodes_str += hex;
        }

        bool has_match = true;
        for (size_t idx = 0; idx < check_nodes.size(); ++idx) {
          if (!reverse_nodes[idx].Equals(check_nodes[idx])) {
            has_match = false;
            break;
          }
        }
        if (has_match) {
          target_branch_indexes.emplace_back(index);
          checked_nodes_size_list.emplace_back(check_nodes.size());
        }
      }
    }
  }

  for (size_t index = 0; index < target_branch_indexes.size(); ++index) {
    const auto& target_index = target_branch_indexes[index];
    const auto& checked_size = checked_nodes_size_list[index];
    std::vector<ByteData256> check_nodes;
    if (!target_nodes.empty()) {
      size_t copy_len = target_nodes.size() - checked_size;
      for (size_t idx = 0; idx < copy_len; ++idx) {
        check_nodes.emplace_back(target_nodes[idx]);
      }
    }

    try {
      auto new_branch =
          branch_list_[target_index].ChangeTapLeaf(tapscript, check_nodes);
      // ignore invalid target.
      if (new_branch.GetBaseHash().IsEmpty()) continue;

      auto based_branch = *this;
      std::vector<TapBranch> copy_branches;
      for (size_t idx = 0; idx < target_index; ++idx) {
        copy_branches.emplace_back(branch_list_[idx]);
      }
      based_branch.branch_list_ = copy_branches;

      new_branch.AddBranch(based_branch);
      for (size_t idx = target_index + 1; idx < branch_list_.size(); ++idx) {
        new_branch.AddBranch(branch_list_[idx]);
      }
      new_branches.emplace_back(new_branch);
    } catch (const CfdException&) {
      // target not found
    }
  }
  if (new_branches.empty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "The specified tapscript does not exist under this branch.");
  }
  return new_branches[0];  // response is top data.
}